

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_transport.c
# Opt level: O2

int tr_tcp_recv(void *tr_tcp_sock,void *pdu,size_t len,time_t timeout)

{
  long lVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  int __flags;
  undefined8 uVar6;
  char *frmt;
  undefined8 uVar7;
  long in_FS_OFFSET;
  timeval t;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (timeout == 0) {
    iVar2 = *tr_tcp_sock;
    __flags = 0x40;
LAB_00108c43:
    sVar3 = recv(iVar2,pdu,len,__flags);
    iVar2 = (int)sVar3;
    if (iVar2 == 0) {
      iVar2 = -4;
      goto LAB_00108cb2;
    }
    if (iVar2 != -1) goto LAB_00108cb2;
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    if (iVar2 == 0xb) {
      iVar2 = -2;
      goto LAB_00108cb2;
    }
    if (iVar2 == 4) {
      iVar2 = -3;
      goto LAB_00108cb2;
    }
    uVar7 = *(undefined8 *)((long)tr_tcp_sock + 8);
    uVar6 = *(undefined8 *)((long)tr_tcp_sock + 0x10);
    pcVar5 = strerror(iVar2);
    frmt = "TCP Transport(%s:%s): recv(..) error: %s";
  }
  else {
    t.tv_usec = 0;
    t.tv_sec = timeout;
    iVar2 = setsockopt(*tr_tcp_sock,1,0x14,&t,0x10);
    if (iVar2 != -1) {
      iVar2 = *tr_tcp_sock;
      __flags = 0;
      goto LAB_00108c43;
    }
    uVar7 = *(undefined8 *)((long)tr_tcp_sock + 8);
    uVar6 = *(undefined8 *)((long)tr_tcp_sock + 0x10);
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    frmt = "TCP Transport(%s:%s): setting SO_RCVTIMEO failed, %s";
  }
  lrtr_dbg(frmt,uVar7,uVar6,pcVar5);
  iVar2 = -1;
LAB_00108cb2:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int tr_tcp_recv(const void *tr_tcp_sock, void *pdu, const size_t len, const time_t timeout)
{
	const struct tr_tcp_socket *tcp_socket = tr_tcp_sock;
	int rtval;

	if (timeout == 0) {
		rtval = recv(tcp_socket->socket, pdu, len, MSG_DONTWAIT);
	} else {
		struct timeval t = {timeout, 0};

		if (setsockopt(tcp_socket->socket, SOL_SOCKET, SO_RCVTIMEO, &t, sizeof(t)) == -1) {
			TCP_DBG("setting SO_RCVTIMEO failed, %s", tcp_socket, strerror(errno));
			return TR_ERROR;
		}
		rtval = recv(tcp_socket->socket, pdu, len, 0);
	}

	if (rtval == -1) {
		if (errno == EAGAIN || errno == EWOULDBLOCK)
			return TR_WOULDBLOCK;
		if (errno == EINTR)
			return TR_INTR;
		TCP_DBG("recv(..) error: %s", tcp_socket, strerror(errno));
		return TR_ERROR;
	}
	if (rtval == 0)
		return TR_CLOSED;
	return rtval;
}